

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_base.h
# Opt level: O0

Ptr __thiscall core::TypedImageBase<signed_char>::duplicate_base(TypedImageBase<signed_char> *this)

{
  TypedImageBase<signed_char> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  TypedImageBase<signed_char> *in_RSI;
  Ptr PVar1;
  TypedImageBase<signed_char> *this_local;
  
  this_00 = (TypedImageBase<signed_char> *)operator_new(0x30);
  TypedImageBase(this_00,in_RSI);
  std::shared_ptr<core::ImageBase>::shared_ptr<core::TypedImageBase<signed_char>,void>
            ((shared_ptr<core::ImageBase> *)this,this_00);
  PVar1.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_ImageBase;
  return (Ptr)PVar1.super___shared_ptr<core::ImageBase,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline ImageBase::Ptr
TypedImageBase<T>::duplicate_base (void) const
{
    return ImageBase::Ptr(new TypedImageBase<T>(*this));
}